

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt * __thiscall slang::SVInt::operator++(SVInt *this)

{
  uint64_t *dst;
  uint64_t *src;
  bool bVar1;
  uint32_t len;
  SVInt *in_RDI;
  SVInt *unaff_retaddr;
  SVInt *in_stack_00000010;
  
  bVar1 = isSingleWord(in_RDI);
  if (bVar1) {
    (in_RDI->super_SVIntStorage).field_0.pVal =
         (uint64_t *)((in_RDI->super_SVIntStorage).field_0.val + 1);
  }
  else if (((in_RDI->super_SVIntStorage).unknownFlag & 1U) == 0) {
    dst = (in_RDI->super_SVIntStorage).field_0.pVal;
    src = (in_RDI->super_SVIntStorage).field_0.pVal;
    len = getNumWords((SVInt *)0x3551d0);
    addOne(dst,src,len,1);
  }
  else {
    setAllX(unaff_retaddr);
  }
  clearUnusedBits(in_stack_00000010);
  return in_RDI;
}

Assistant:

SVInt& SVInt::operator++() {
    if (isSingleWord())
        ++val;
    else if (unknownFlag)
        setAllX();
    else
        addOne(pVal, pVal, getNumWords(), 1);
    clearUnusedBits();
    return *this;
}